

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O1

void google::LogDestination::SetLogSymlink(LogSeverity severity,char *symlink_basename)

{
  long lVar1;
  char *pcVar2;
  int iVar3;
  LogDestination *this;
  Mutex *pMVar4;
  MutexLock l;
  MutexLock local_40;
  LogMessageFatal local_38;
  
  local_38.super_LogMessage.allocated_ =
       (LogMessageData *)CONCAT44(local_38.super_LogMessage.allocated_._4_4_,severity);
  local_40.mu_ = local_40.mu_ & 0xffffffff00000000;
  if (severity < 0) {
    pMVar4 = (Mutex *)MakeCheckOpString<int,int>((int *)&local_38,(int *)&local_40,"severity >= 0");
  }
  else {
    pMVar4 = (Mutex *)0x0;
  }
  if (pMVar4 != (Mutex *)0x0) {
    iVar3 = 0x262;
    local_40.mu_ = pMVar4;
LAB_0011663c:
    LogMessageFatal::LogMessageFatal
              (&local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
               ,iVar3,(CheckOpString *)&local_40);
    LogMessageFatal::~LogMessageFatal(&local_38);
  }
  local_38.super_LogMessage.allocated_ =
       (LogMessageData *)CONCAT44(local_38.super_LogMessage.allocated_._4_4_,severity);
  local_40.mu_._0_4_ = 4;
  if (severity < 4) {
    local_40.mu_ = (Mutex *)0x0;
  }
  else {
    local_40.mu_ = (Mutex *)MakeCheckOpString<int,int>
                                      ((int *)&local_38,(int *)&local_40,"severity < NUM_SEVERITIES"
                                      );
  }
  if (local_40.mu_ != (Mutex *)0x0) {
    iVar3 = 0x263;
    goto LAB_0011663c;
  }
  local_40.mu_ = (Mutex *)log_mutex;
  if (log_mutex[0x38] == '\x01') {
    iVar3 = pthread_rwlock_wrlock((pthread_rwlock_t *)log_mutex);
    if (iVar3 != 0) goto LAB_00116668;
  }
  if (3 < (uint)severity) {
    __assert_fail("severity >=0 && severity < NUM_SEVERITIES",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
                  ,0x32d,
                  "static LogDestination *google::LogDestination::log_destination(LogSeverity)");
  }
  if ((&log_destinations_)[(uint)severity] == 0) {
    this = (LogDestination *)operator_new(0xe0);
    LogDestination(this,severity,(char *)0x0);
    (&log_destinations_)[(uint)severity] = this;
  }
  lVar1 = (&log_destinations_)[(uint)severity];
  local_38.super_LogMessage.allocated_ = (LogMessageData *)(lVar1 + 8);
  if (*(char *)(lVar1 + 0x40) != '\0') {
    iVar3 = pthread_rwlock_wrlock((pthread_rwlock_t *)local_38.super_LogMessage.allocated_);
    if (iVar3 != 0) {
LAB_00116668:
      abort();
    }
  }
  pcVar2 = *(char **)(lVar1 + 0x78);
  strlen(symlink_basename);
  std::__cxx11::string::_M_replace(lVar1 + 0x70,0,pcVar2,(ulong)symlink_basename);
  ::glog_internal_namespace_::MutexLock::~MutexLock((MutexLock *)&local_38);
  ::glog_internal_namespace_::MutexLock::~MutexLock(&local_40);
  return;
}

Assistant:

inline void LogDestination::SetLogSymlink(LogSeverity severity,
                                          const char* symlink_basename) {
  CHECK_GE(severity, 0);
  CHECK_LT(severity, NUM_SEVERITIES);
  MutexLock l(&log_mutex);
  log_destination(severity)->fileobject_.SetSymlinkBasename(symlink_basename);
}